

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.h
# Opt level: O0

void __thiscall Plane::Plane(Plane *this,Vector3f *norm,float d,Material *m)

{
  ulong uVar1;
  Vector3f *in_RDX;
  Object *in_RDI;
  undefined4 in_XMM0_Da;
  Plane *in_stack_00000050;
  
  Object::Object(in_RDI,(Material *)in_RDX);
  in_RDI->_vptr_Object = (_func_int **)&PTR_intersect_003d2a38;
  Vector3f::Vector3f(in_RDX,(Vector3f *)in_RDI);
  *(undefined4 *)&in_RDI[1].field_0xc = in_XMM0_Da;
  Vector3f::Vector3f((Vector3f *)&in_RDI[1].m,0.0);
  Matrix3f::Matrix3f((Matrix3f *)((long)&in_RDI[2]._vptr_Object + 4),0.0);
  Vector3f::length((Vector3f *)0x3584b6);
  Vector3f::normalize(in_RDX);
  uVar1 = (**(code **)(*(long *)in_RDX->m_elements + 0x10))();
  if ((uVar1 & 1) != 0) {
    prepare_coords(in_stack_00000050);
  }
  return;
}

Assistant:

Plane(const Vector3f& norm, float d, Material*m):
		norm(norm),d(d),Object(m) {
		d /= this->norm.length();
		this->norm.normalize();
		if (m->need_coords()) prepare_coords();
	}